

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::CleanPolygon(Path *in_poly,Path *out_poly,double distance)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  OutPt *pOVar3;
  const_reference pvVar4;
  reference pvVar5;
  bool bVar6;
  double distSqrd_00;
  OutPt *local_c0;
  OutPt *local_a0;
  size_t i_1;
  OutPt *local_58;
  OutPt *op;
  double distSqrd;
  size_t i;
  OutPt *outPts;
  size_t size;
  double distance_local;
  Path *out_poly_local;
  Path *in_poly_local;
  
  outPts = (OutPt *)std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                              (in_poly);
  if (outPts == (OutPt *)0x0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::clear(out_poly);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = outPts;
    uVar2 = SUB168(auVar1 * ZEXT816(0x28),0);
    if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pOVar3 = (OutPt *)operator_new__(uVar2);
    if (outPts != (OutPt *)0x0) {
      local_c0 = pOVar3;
      do {
        OutPt::OutPt(local_c0);
        local_c0 = local_c0 + 1;
      } while (local_c0 != pOVar3 + (long)outPts);
    }
    for (distSqrd = 0.0; (ulong)distSqrd < outPts; distSqrd = (double)((long)distSqrd + 1)) {
      pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (in_poly,(size_type)distSqrd);
      pOVar3[(long)distSqrd].Pt.X = pvVar4->X;
      pOVar3[(long)distSqrd].Pt.Y = pvVar4->Y;
      pOVar3[(long)distSqrd].Next = pOVar3 + ((long)distSqrd + 1U) % (ulong)outPts;
      (pOVar3[(long)distSqrd].Next)->Prev = pOVar3 + (long)distSqrd;
      pOVar3[(long)distSqrd].Idx = 0;
    }
    distSqrd_00 = distance * distance;
    local_58 = pOVar3;
    while( true ) {
      bVar6 = false;
      if (local_58->Idx == 0) {
        bVar6 = local_58->Next != local_58->Prev;
      }
      if (!bVar6) break;
      bVar6 = PointsAreClose(local_58->Pt,local_58->Prev->Pt,distSqrd_00);
      if (bVar6) {
        local_58 = ExcludeOp(local_58);
        outPts = (OutPt *)((long)&outPts[-1].Prev + 7);
      }
      else {
        bVar6 = PointsAreClose(local_58->Prev->Pt,local_58->Next->Pt,distSqrd_00);
        if (bVar6) {
          ExcludeOp(local_58->Next);
          local_58 = ExcludeOp(local_58);
          outPts = (OutPt *)((long)&outPts[-1].Prev + 6);
        }
        else {
          bVar6 = SlopesNearCollinear(&local_58->Prev->Pt,&local_58->Pt,&local_58->Next->Pt,
                                      distSqrd_00);
          if (bVar6) {
            local_58 = ExcludeOp(local_58);
            outPts = (OutPt *)((long)&outPts[-1].Prev + 7);
          }
          else {
            local_58->Idx = 1;
            local_58 = local_58->Next;
          }
        }
      }
    }
    if (outPts < (OutPt *)0x3) {
      outPts = (OutPt *)0x0;
    }
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::resize
              (out_poly,(size_type)outPts);
    for (local_a0 = (OutPt *)0x0; local_a0 < outPts; local_a0 = (OutPt *)((long)&local_a0->Idx + 1))
    {
      pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (out_poly,(size_type)local_a0);
      pvVar5->X = (local_58->Pt).X;
      pvVar5->Y = (local_58->Pt).Y;
      local_58 = local_58->Next;
    }
    if (pOVar3 != (OutPt *)0x0) {
      operator_delete__(pOVar3);
    }
  }
  return;
}

Assistant:

void CleanPolygon(const Path& in_poly, Path& out_poly, double distance)
{
  //distance = proximity in units/pixels below which vertices
  //will be stripped. Default ~= sqrt(2).
  
  size_t size = in_poly.size();
  
  if (size == 0) 
  {
    out_poly.clear();
    return;
  }

  OutPt* outPts = new OutPt[size];
  for (size_t i = 0; i < size; ++i)
  {
    outPts[i].Pt = in_poly[i];
    outPts[i].Next = &outPts[(i + 1) % size];
    outPts[i].Next->Prev = &outPts[i];
    outPts[i].Idx = 0;
  }

  double distSqrd = distance * distance;
  OutPt* op = &outPts[0];
  while (op->Idx == 0 && op->Next != op->Prev) 
  {
    if (PointsAreClose(op->Pt, op->Prev->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    } 
    else if (PointsAreClose(op->Prev->Pt, op->Next->Pt, distSqrd))
    {
      ExcludeOp(op->Next);
      op = ExcludeOp(op);
      size -= 2;
    }
    else if (SlopesNearCollinear(op->Prev->Pt, op->Pt, op->Next->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    }
    else
    {
      op->Idx = 1;
      op = op->Next;
    }
  }

  if (size < 3) size = 0;
  out_poly.resize(size);
  for (size_t i = 0; i < size; ++i)
  {
    out_poly[i] = op->Pt;
    op = op->Next;
  }
  delete [] outPts;
}